

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

TValue * rec_mm_concat_cp(lua_State *L,lua_CFunction dummy,void *ud)

{
  uint uVar1;
  jit_State *J;
  TRef *pTVar2;
  TValue TVar3;
  TValue TVar4;
  TValue TVar5;
  TRef TVar6;
  TRef TVar7;
  TValue *pTVar8;
  BCReg BVar9;
  ulong uVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  RecordIndex ix;
  TValue local_78;
  TValue local_70;
  uint local_48;
  uint local_44;
  
  J = *(jit_State **)((long)ud + 0x28);
  uVar13 = *(uint *)((long)ud + 0x30);
  uVar10 = (ulong)uVar13;
  uVar1 = *(uint *)((long)ud + 0x34);
  puVar11 = J->base + uVar1;
  for (; uVar13 <= uVar1; uVar13 = uVar13 + 1) {
    if (J->base[uVar13] == 0) {
      sload(J,uVar13);
    }
  }
  if ((((*puVar11 & 0x1f000000) == 0x4000000) || ((*puVar11 >> 0x18 & 0x1e) - 0xe < 6)) &&
     (((puVar11[-1] & 0x1f000000) == 0x4000000 || ((puVar11[-1] >> 0x18 & 0x1e) - 0xe < 6)))) {
    pTVar2 = J->base;
    for (puVar12 = puVar11; pTVar2 + uVar10 <= puVar12; puVar12 = puVar12 + -1) {
      uVar13 = *puVar12;
      if ((uVar13 >> 0x18 & 0x1e) - 0xe < 6) {
        (J->fold).ins.field_0.ot = 0x5b04;
        (J->fold).ins.field_0.op1 = (IRRef1)uVar13;
        *(ushort *)((long)&(J->fold).ins + 2) = (ushort)((uVar13 & 0x1f000000) == 0xe000000);
        TVar6 = lj_opt_fold(J);
        *puVar12 = TVar6;
      }
      else if ((uVar13 & 0x1f000000) != 0x4000000) break;
    }
    puVar12 = puVar12 + 1;
    TVar6 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
    TVar7 = lj_opt_fold(J);
    puVar14 = puVar12;
    TVar6 = TVar7;
    do {
      uVar13 = *puVar14;
      puVar14 = puVar14 + 1;
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)uVar13;
      TVar6 = lj_opt_fold(J);
    } while (puVar14 <= puVar11);
    (J->fold).ins.field_0.ot = 0x5504;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar6 = lj_opt_fold(J);
    BVar9 = (BCReg)((ulong)((long)puVar12 - (long)J->base) >> 2);
    J->maxslot = BVar9;
    if (puVar12 == pTVar2 + uVar10) goto LAB_001521e7;
    uVar13 = BVar9 - 1;
    J->maxslot = uVar13;
    *(BCReg *)((long)ud + 0x34) = BVar9;
    pTVar8 = L->base;
    uVar10 = (ulong)(BVar9 - 1);
    *(TValue *)((long)ud + 0x20) = pTVar8[uVar10 + 4];
    TVar3 = pTVar8[uVar10];
    TVar4 = (pTVar8 + uVar10)[1];
    TVar5 = (pTVar8 + uVar10 + 2)[1];
    *(TValue *)((long)ud + 0x10) = pTVar8[uVar10 + 2];
    *(TValue *)((long)ud + 0x18) = TVar5;
    *(TValue *)ud = TVar3;
    *(TValue *)((long)ud + 8) = TVar4;
    *puVar12 = TVar6;
    local_70.field_2.it = 0xfffffffb;
    local_70.u32.lo = (int)J + -0x150;
    pTVar8 = J->L->base;
  }
  else {
    uVar13 = uVar1 - 1;
    J->maxslot = uVar13;
    pTVar8 = J->L->base;
    local_70 = pTVar8[uVar1];
    puVar12 = puVar11;
  }
  local_78 = pTVar8[uVar13];
  local_48 = puVar12[-1];
  local_44 = *puVar12;
  rec_mm_arith(J,(RecordIndex *)&local_78.field_2,MM_concat);
  TVar6 = 0;
LAB_001521e7:
  *(TRef *)((long)ud + 0x38) = TVar6;
  return (TValue *)0x0;
}

Assistant:

static TValue *rec_mm_concat_cp(lua_State *L, lua_CFunction dummy, void *ud)
{
  RecCatDataCP *rcd = (RecCatDataCP *)ud;
  jit_State *J = rcd->J;
  BCReg baseslot = rcd->baseslot, topslot = rcd->topslot;
  TRef *top = &J->base[topslot];
  BCReg s;
  RecordIndex ix;
  UNUSED(L); UNUSED(dummy);
  lj_assertJ(baseslot < topslot, "bad CAT arg");
  for (s = baseslot; s <= topslot; s++)
    (void)getslot(J, s);  /* Ensure all arguments have a reference. */
  if (tref_isnumber_str(top[0]) && tref_isnumber_str(top[-1])) {
    TRef tr, hdr, *trp, *xbase, *base = &J->base[baseslot];
    /* First convert numbers to strings. */
    for (trp = top; trp >= base; trp--) {
      if (tref_isnumber(*trp))
	*trp = emitir(IRT(IR_TOSTR, IRT_STR), *trp,
		      tref_isnum(*trp) ? IRTOSTR_NUM : IRTOSTR_INT);
      else if (!tref_isstr(*trp))
	break;
    }
    xbase = ++trp;
    tr = hdr = emitir(IRT(IR_BUFHDR, IRT_PGC),
		      lj_ir_kptr(J, &J2G(J)->tmpbuf), IRBUFHDR_RESET);
    do {
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, *trp++);
    } while (trp <= top);
    tr = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
    J->maxslot = (BCReg)(xbase - J->base);
    if (xbase == base) {
      rcd->tr = tr;  /* Return simple concatenation result. */
      return NULL;
    }
    /* Pass partial result. */
    rcd->topslot = topslot = J->maxslot--;
    /* Save updated range of slots. */
    memcpy(rcd->savetv, &L->base[topslot-1], sizeof(rcd->savetv));
    *xbase = tr;
    top = xbase;
    setstrV(J->L, &ix.keyv, &J2G(J)->strempty);  /* Simulate string result. */
  } else {
    J->maxslot = topslot-1;
    copyTV(J->L, &ix.keyv, &J->L->base[topslot]);
  }
  copyTV(J->L, &ix.tabv, &J->L->base[topslot-1]);
  ix.tab = top[-1];
  ix.key = top[0];
  rec_mm_arith(J, &ix, MM_concat);  /* Call __concat metamethod. */
  rcd->tr = 0;  /* No result yet. */
  return NULL;
}